

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O2

char * CaptureHashCount(char *szDataPtr,char *szDataEnd,size_t *PtrHashCount)

{
  size_t in_RCX;
  size_t sVar1;
  BYTE HashValue [16];
  BYTE aBStack_38 [24];
  
  sVar1 = 0;
  while( true ) {
    if (szDataEnd <= szDataPtr) {
      *PtrHashCount = sVar1;
      return (char *)(byte *)szDataPtr;
    }
    szDataPtr = CaptureSingleHash(szDataPtr,szDataEnd,aBStack_38,in_RCX);
    if ((byte *)szDataPtr == (byte *)0x0) break;
    for (; (szDataPtr < szDataEnd && ((byte)*szDataPtr < 0x21));
        szDataPtr = (char *)((byte *)szDataPtr + 1)) {
    }
    sVar1 = sVar1 + 1;
  }
  return (char *)0x0;
}

Assistant:

static const char * CaptureHashCount(const char * szDataPtr, const char * szDataEnd, size_t * PtrHashCount)
{
    BYTE HashValue[MD5_HASH_SIZE];
    size_t HashCount = 0;

    // Capculate the hash count
    while (szDataPtr < szDataEnd)
    {
        // Check one hash
        szDataPtr = CaptureSingleHash(szDataPtr, szDataEnd, HashValue, MD5_HASH_SIZE);
        if (szDataPtr == NULL)
            return NULL;

        // Skip all whitespaces
        while (szDataPtr < szDataEnd && IsWhiteSpace(szDataPtr))
            szDataPtr++;

        HashCount++;
    }

    // Give results
    PtrHashCount[0] = HashCount;
    return szDataPtr;
}